

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O1

void __thiscall HDual::solve(HDual *this,HModel *ptr_model,int variant,int num_threads)

{
  HVector *this_00;
  double dVar1;
  int iVar2;
  HModel *pHVar3;
  HModel *pHVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  timeval tv;
  HPrimal local_2a8;
  
  this->dual_variant = variant;
  this->model = ptr_model;
  puts("model->mlFg_Report() 1");
  std::ostream::flush();
  HModel::mlFg_Report(this->model);
  std::ostream::flush();
  HVector::setup(&this->model->buffer,this->model->numRow);
  HVector::setup(&this->model->bufferLong,this->model->numCol);
  HModel::setup_for_solve(this->model);
  pHVar3 = this->model;
  pHVar3->problemStatus = -1;
  pHVar3->numberIteration = 0;
  this->totalRebuilds = 0;
  this->totalRebuildTime = 0.0;
  pHVar3->totalInverts = 0;
  pHVar3->totalInvertTime = 0.0;
  if (pHVar3->numRow != 0) {
    puts("model->mlFg_Report() 2");
    std::ostream::flush();
    HModel::mlFg_Report(this->model);
    std::ostream::flush();
    HTimer::reset(&this->model->timer);
    this->n_ph1_du_it = 0;
    this->n_ph2_du_it = 0;
    this->n_pr_it = 0;
    this->SolveBailout = false;
    if ((this->TimeLimitValue == 0.0) && (!NAN(this->TimeLimitValue))) {
      this->TimeLimitValue = 1000000.0;
      printf("Setting TimeLimitValue = %g\n",0);
    }
    init(this,(EVP_PKEY_CTX *)(ulong)(uint)num_threads);
    HModel::initCost(this->model,1);
    if (this->model->mlFg_haveFreshInvert == 0) {
      HModel::computeFactor(this->model);
    }
    pHVar3 = this->model;
    if (pHVar3->mlFg_haveEdWt == 0) {
      if (this->EdWt_Mode == 0) {
        this->n_wg_DSE_wt = 0;
        uVar9 = this->numRow - pHVar3->numBasicLogicals;
        if ((uVar9 == 0 || this->numRow < pHVar3->numBasicLogicals) || (this->iz_DSE_wt != true)) {
          printf("solve:: %d basic structurals: starting from B=I so unit initial DSE weights\n",
                 (ulong)uVar9);
        }
        else {
          gettimeofday((timeval *)&local_2a8,(__timezone_ptr_t)0x0);
          dVar5 = (double)(long)local_2a8.TimeLimitValue;
          dVar11 = (double)(long)local_2a8._8_8_;
          dVar1 = (pHVar3->timer).startTime;
          if (0 < this->numRow) {
            this_00 = &this->row_ep;
            lVar10 = 0;
            do {
              HVector::clear(this_00);
              (this->row_ep).count = 1;
              *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = (int)lVar10;
              (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] = 1.0;
              (this->row_ep).packFlag = false;
              HFactor::btran(this->factor,this_00,this->row_epDensity);
              dVar6 = HVector::norm2(this_00);
              (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] = dVar6;
              this->row_epDensity =
                   ((double)(this->row_ep).count * 0.05) / (double)this->numRow +
                   this->row_epDensity * 0.95;
              lVar10 = lVar10 + 1;
            } while (lVar10 < this->numRow);
          }
          pHVar3 = this->model;
          gettimeofday((timeval *)&local_2a8,(__timezone_ptr_t)0x0);
          dVar1 = (dVar1 - (dVar11 / 1000000.0 + dVar5)) +
                  (((double)(long)local_2a8._8_8_ / 1000000.0 +
                   (double)(long)local_2a8.TimeLimitValue) - (pHVar3->timer).startTime);
          printf("Computed %d initial DSE weights in %gs\n",(ulong)(uint)this->numRow);
          printf("solve:: %d basic structurals: computed %d initial DSE weights in %gs, %d, %d, %g\n"
                 ,SUB84(dVar1,0),dVar1,(ulong)uVar9,(ulong)(uint)this->numRow,(ulong)uVar9,
                 (ulong)(uint)this->numRow);
        }
      }
      else if (this->EdWt_Mode == 1) {
        this->n_dvx_fwk = 0;
        local_2a8.TimeLimitValue = (double)((ulong)local_2a8.TimeLimitValue & 0xffffffff00000000);
        std::vector<int,_std::allocator<int>_>::_M_fill_assign
                  (&this->dvx_ix,(long)this->numTot,(value_type *)&local_2a8);
        iz_dvx_fwk(this);
      }
      this->model->mlFg_haveEdWt = 1;
    }
    HModel::computeDual(this->model);
    HModel::computeDualInfeasInDual(this->model,&this->dualInfeasCount);
    iVar8 = (this->dualInfeasCount < 1) + 1;
    this->solvePhase = iVar8;
    bVar7 = HModel::OKtoSolve(this->model,1,iVar8);
    if (!bVar7) {
      puts("NOT OK TO SOLVE???");
      std::ostream::flush();
    }
    while (iVar8 = this->solvePhase, iVar8 != 0) {
      if (iVar8 != 4) {
        iVar2 = this->model->numberIteration;
        if (iVar8 == 2) {
          solve_phase2(this);
          this->n_ph2_du_it = this->n_ph2_du_it + (this->model->numberIteration - iVar2);
        }
        else if (iVar8 == 1) {
          solve_phase1(this);
          this->n_ph1_du_it = this->n_ph1_du_it + (this->model->numberIteration - iVar2);
        }
        else {
          this->solvePhase = 0;
        }
      }
      if ((this->solvePhase == 4) || ((this->SolveBailout & 1U) != 0)) break;
    }
    if (this->dual_variant == 0) {
      local_2a8.numCol = 0x14;
      local_2a8.numRow = 0x13;
      local_2a8.numTot = 0x15;
      local_2a8.limitUpdate = 0x16;
      local_2a8.totalRebuildTime = 2.75859452884773e-313;
      local_2a8.model = (HModel *)0x100000000e;
      local_2a8.TimeLimitValue = 2.12199579140993e-313;
      local_2a8._8_8_ = 0x1200000011;
      local_2a8.countUpdate = 0x17;
      local_2a8.invertHint = 0x18;
      HTimer::report(&this->model->timer,0xe,(int *)&local_2a8);
    }
    if (this->dual_variant == 1) {
      local_2a8.countUpdate = 0x17;
      local_2a8.invertHint = 0x18;
      local_2a8.columnIn = 0;
      local_2a8.rowOut = 1;
      local_2a8.numCol = 0x14;
      local_2a8.numRow = 0x13;
      local_2a8.numTot = 0x15;
      local_2a8.limitUpdate = 0x16;
      local_2a8.totalRebuildTime = 2.75859452884773e-313;
      local_2a8.model = (HModel *)0x100000000e;
      local_2a8.TimeLimitValue = 2.12199579140993e-313;
      local_2a8._8_8_ = 0x1200000011;
      HTimer::report(&this->model->timer,0x10,(int *)&local_2a8);
    }
    if (this->dual_variant == 2) {
      local_2a8.countUpdate = 0x17;
      local_2a8.invertHint = 0x18;
      local_2a8.columnIn = 0x19;
      local_2a8.numCol = 0x14;
      local_2a8.numRow = 0x13;
      local_2a8.numTot = 0x15;
      local_2a8.limitUpdate = 0x16;
      local_2a8.totalRebuildTime = 2.75859452884773e-313;
      local_2a8.model = (HModel *)0x100000000e;
      local_2a8.TimeLimitValue = 2.12199579140993e-313;
      local_2a8._8_8_ = 0x1200000011;
      HTimer::report(&this->model->timer,0xf,(int *)&local_2a8);
      pHVar3 = this->model;
      printf("PAMI   %-20s    CUTOFF  %6g    PERSISTENSE  %6g\n",SUB84(pHVar3->dblOption[4],0),
             (double)pHVar3->numberIteration / ((double)this->multi_iteration + 1.0),
             (pHVar3->modelName)._M_dataplus._M_p);
    }
    pHVar3 = this->model;
    if (pHVar3->problemStatus != 6) {
      iVar8 = pHVar3->numberIteration;
      if (this->solvePhase == 4) {
        local_2a8.row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ap.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ap.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ap.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ap.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ap.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ap.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ap.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ap.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ap.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ap.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ap.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ap.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ap.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ap.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ap.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.row_ap.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.row_ap.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.row_ap.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.column.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.column.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.column.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.column.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.column.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.column.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.TimeLimitValue = this->TimeLimitValue;
        HPrimal::solvePhase2(&local_2a8,pHVar3);
        this->totalRebuildTime = local_2a8.totalRebuildTime + this->totalRebuildTime;
        this->totalRebuilds = this->totalRebuilds + local_2a8.totalRebuilds;
        HPrimal::~HPrimal(&local_2a8);
      }
      this->n_pr_it = this->n_pr_it + (this->model->numberIteration - iVar8);
    }
    pHVar3 = this->model;
    gettimeofday((timeval *)&local_2a8,(__timezone_ptr_t)0x0);
    pHVar4 = this->model;
    pHVar4->totalTime =
         (((double)(long)local_2a8._8_8_ / 1000000.0 + (double)(long)local_2a8.TimeLimitValue) -
         (pHVar3->timer).startTime) + pHVar4->totalTime;
    if (this->n_ph2_du_it + this->n_ph1_du_it + this->n_pr_it != pHVar4->numberIteration) {
      puts("Iteration total error ");
    }
    printf("Iterations [Ph1 %d; Ph2 %d; Pr %d] Total %d\n",(ulong)(uint)this->n_ph1_du_it,
           (ulong)(uint)this->n_ph2_du_it,(ulong)(uint)this->n_pr_it,
           (ulong)(uint)this->model->numberIteration);
    if (this->EdWt_Mode == 1) {
      printf("Devex: n_dvx_fwk = %d; Average n_dvx_it = %d\n",(ulong)(uint)this->n_dvx_fwk,
             (long)this->model->numberIteration / (long)this->n_dvx_fwk & 0xffffffff);
    }
    bVar7 = HModel::OKtoSolve(this->model,1,this->solvePhase);
    if (!bVar7) {
      puts("NOT OK After Solve???");
      std::ostream::flush();
    }
    puts("model->mlFg_Report() 9");
    std::ostream::flush();
    HModel::mlFg_Report(this->model);
    std::ostream::flush();
    pHVar3 = this->model;
    printf("Time: Total inverts =  %4d; Total invert  time = %11.4g of Total time = %11.4g",
           SUB84(pHVar3->totalInvertTime,0),pHVar3->totalTime,(ulong)(uint)pHVar3->totalInverts);
    dVar1 = this->model->totalTime;
    if (dVar1 <= 0.001) {
      putchar(10);
    }
    else {
      printf(" (%6.2f%%)\n",SUB84((this->model->totalInvertTime * 100.0) / dVar1,0));
    }
    std::ostream::flush();
    printf("Time: Total rebuilds = %4d; Total rebuild time = %11.4g of Total time = %11.4g",
           SUB84(this->totalRebuildTime,0),this->model->totalTime,(ulong)(uint)this->totalRebuilds);
    dVar1 = this->model->totalTime;
    if (dVar1 <= 0.001) {
      putchar(10);
    }
    else {
      printf(" (%6.2f%%)\n",SUB84((this->totalRebuildTime * 100.0) / dVar1,0));
    }
    std::ostream::flush();
  }
  return;
}

Assistant:

void HDual::solve(HModel *ptr_model, int variant, int num_threads) {
  //  printf("\nEntering solve(HModel *ptr_model, int variant, int num_threads)\n");cout<<flush;
  assert(ptr_model != NULL);
  dual_variant = variant;
  model = ptr_model;
#ifdef JAJH_dev
  printf("model->mlFg_Report() 1\n");cout<<flush; model->mlFg_Report();cout<<flush;
#endif
  //  printf("HDual::solve - model->mlFg_Report() 1\n");cout<<flush; model->mlFg_Report();cout<<flush;
  // Setup two work buffers in model required for solve()
  model->buffer.setup(model->numRow);
  model->bufferLong.setup(model->numCol);
  
  //  printf("model->mlFg_haveEdWt 0 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  
  // Setup aspects of the model data which are needed for solve() but better left until now for efficiency reasons.
  //  printf("HDual::solve - Calling model->setup_for_solve()\n");cout<<flush;
  model->setup_for_solve();
  
  //  printf("model->mlFg_haveEdWt 1 = %d\n", model->mlFg_haveEdWt);cout<<flush;

  model->problemStatus = LP_Status_Unset;
  model->numberIteration = 0;
  //Initialise numbers and times of rebuilds and inverts.
  totalRebuilds = 0;
  totalRebuildTime = 0;
  model->totalInverts = 0;
  model->totalInvertTime = 0;
  //Cannot solve box-constrained LPs
  if (model->numRow == 0) return;
#ifdef JAJH_dev
  printf("model->mlFg_Report() 2\n");cout<<flush; model->mlFg_Report();cout<<flush;
#endif

  model->timer.reset();

  n_ph1_du_it = 0;
  n_ph2_du_it = 0;
  n_pr_it = 0;
  //Set SolveBailout to be true if control is to be returned immediately to calling function
  SolveBailout = false;
  if (TimeLimitValue == 0) {
    TimeLimitValue = 1000000.0;
#ifdef JAJH_dev
    printf("Setting TimeLimitValue = %g\n", TimeLimitValue);
#endif
  }
  
  // Initialise working environment
  //Does LOTS, including initialisation of edge weights. Should only
  //be called if model dimension changes
  init(num_threads);
  
  model->initCost(1);
  if (!model->mlFg_haveFreshInvert) model->computeFactor();

  //Consider initialising edge weights
  //
  //NB workEdWt is assigned and initialised to 1s in
  //dualRHS.setup(model) so that CHUZR is well defined, even for
  //Dantzig pricing
  //
  //  printf("model->mlFg_haveEdWt 2 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  if (!model->mlFg_haveEdWt) {
    //Edge weights are not known
    //Set up edge weights according to EdWt_Mode and iz_DSE_wt
    if (EdWt_Mode == EdWt_Mode_Dvx) {
      //Using dual Devex edge weights
      //Zero the number of Devex frameworks used and set up the first one
      n_dvx_fwk = 0;
      dvx_ix.assign(numTot, 0);
      iz_dvx_fwk();}
    else if (EdWt_Mode == EdWt_Mode_DSE) {
      //Using dual steepest edge (DSE) weights
#ifdef JAJH_dev
      n_wg_DSE_wt = 0;
#endif
      int numBasicStructurals = numRow - model->numBasicLogicals;
      if (numBasicStructurals > 0 && iz_DSE_wt) {
	//Basis is not logical and DSE weights are to be initialised
	//printf("Compute exct DSE weights\n");
	double IzDseEdWtTT = model->timer.getTime();
	for (int i = 0; i < numRow; i++) {
	  row_ep.clear();
	  row_ep.count = 1;
	  row_ep.index[0] = i;
	  row_ep.array[i] = 1;
	  row_ep.packFlag = false;
	  factor->btran(row_ep, row_epDensity);
	  dualRHS.workEdWt[i] = row_ep.norm2();
	  row_epDensity *= 0.95;
	  row_epDensity += 0.05 * row_ep.count / numRow;
	}
	IzDseEdWtTT = model->timer.getTime() - IzDseEdWtTT;
#ifdef JAJH_dev
	printf("Computed %d initial DSE weights in %gs\n", numRow, IzDseEdWtTT);
#endif
	printf("solve:: %d basic structurals: computed %d initial DSE weights in %gs, %d, %d, %g\n",
	numBasicStructurals, numRow, IzDseEdWtTT, numBasicStructurals, numRow, IzDseEdWtTT);
      } else {
	printf("solve:: %d basic structurals: starting from B=I so unit initial DSE weights\n", numBasicStructurals);
      }
    }
    //Indicate that edge weights are known
    model->mlFg_haveEdWt = 1;
  }
  //  printf("model->mlFg_haveEdWt 3 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  
  model->computeDual();
  
  //  printf("Solve: Computed dual\n");cout<<flush;

#ifdef JAJH_dev
  bool rp_bs_cond = false;
  if (rp_bs_cond) {
    double bs_cond = an_bs_cond(ptr_model);
    printf("Initial basis condition estimate is %g\n", bs_cond);
  }
#endif
  
  //  printf("HDual::solve - Calling model->computeDualInfeasInDual\n");cout<<flush;
  model->computeDualInfeasInDual(&dualInfeasCount);
  solvePhase = dualInfeasCount > 0 ? 1 : 2;
  
  //  printf("Solve: Computed phase = %d\n", solvePhase);cout<<flush;

  // Find largest dual and adjust the dual tolerance accordingly
  double largeDual = 0;
  for (int i = 0; i < numTot; i++) {
    if (model->getNonbasicFlag()[i]) {
      double myDual = fabs(workDual[i] * jMove[i]);
      if (largeDual < myDual)
	largeDual = myDual;
    }
  }
  
  // Check that the model is OK to solve:
  //
  // Level 0 just checks the flags
  //
  // Level 1 also checks that the basis is OK and that the necessary
  // data in work* is populated.
  //
  // Level 2 (will) checks things like the nonbasic duals and basic
  // primal values
  //
  // Level 3 (will) checks expensive things like the INVERT and
  // steepeest edge weights
  //
  bool ok = model->OKtoSolve(1, solvePhase);
  if (!ok) {printf("NOT OK TO SOLVE???\n");cout<<flush;}
  //  assert(ok);
  
  //  rp_hsol_sol(ptr_model);


  //	Analyse the initial values of primal and dual variables
  //  an_iz_vr_v();
  
  // The major solving loop
  
  while (solvePhase) {
#ifdef JAJH_dev
    int it0 = model->numberIteration;
    //printf("HDual::solve Phase %d: Iteration %d; totalTime = %g; timer.getTime = %g\n", solvePhase, model->numberIteration, model->totalTime, model->timer.getTime());
#endif
    switch (solvePhase) {
    case 1:
      solve_phase1();
#ifdef JAJH_dev
      n_ph1_du_it += (model->numberIteration - it0);
#endif
      break;
    case 2:
      solve_phase2();
#ifdef JAJH_dev
      n_ph2_du_it += (model->numberIteration - it0);
#endif
      break;
    case 4:
      break;
    default:
      solvePhase = 0;
      break;
    }
    // Jump for primal
    if (solvePhase == 4)
      break;
    // Possibly bail out
    if (SolveBailout)
      break;
  }
  
#ifdef JAJH_dev
  // Report the ticks before primal
  if (dual_variant == HDUAL_VARIANT_PLAIN) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
  }
  
  if (dual_variant == HDUAL_VARIANT_TASKS) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR, HTICK_GROUP1, HTICK_GROUP2 };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
  }
  
  if (dual_variant == HDUAL_VARIANT_MULTI) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR, HTICK_UPDATE_ROW_EP };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
    printf("PAMI   %-20s    CUTOFF  %6g    PERSISTENSE  %6g\n",
	   model->modelName.c_str(), model->dblOption[DBLOPT_PAMI_CUTOFF],
	   model->numberIteration / (1.0 + multi_iteration));
  }
#endif
  
  if (model->problemStatus != LP_Status_OutOfTime) {
    // Use primal to clean up if not out of time
#ifdef JAJH_dev
    int it0 = model->numberIteration;
#endif
    if (solvePhase == 4) {
      HPrimal hPrimal;
      hPrimal.TimeLimitValue = TimeLimitValue;
      hPrimal.solvePhase2(model);
      //Add in the count and time for any primal rebuilds
      totalRebuildTime += hPrimal.totalRebuildTime;
      totalRebuilds += hPrimal.totalRebuilds;
    }
#ifdef JAJH_dev
    n_pr_it += (model->numberIteration - it0);
#endif
  }
  // Save the solved results
  model->totalTime += model->timer.getTime();
  
#ifdef JAJH_dev
  if (n_ph1_du_it + n_ph2_du_it + n_pr_it != model->numberIteration) {
    printf("Iteration total error \n");
  }
  printf("Iterations [Ph1 %d; Ph2 %d; Pr %d] Total %d\n", n_ph1_du_it,
  		n_ph2_du_it, n_pr_it, model->numberIteration);
  if (EdWt_Mode == EdWt_Mode_Dvx) {
    printf("Devex: n_dvx_fwk = %d; Average n_dvx_it = %d\n", n_dvx_fwk,
	   model->numberIteration / n_dvx_fwk);
  }
  if (rp_bs_cond) {
    double bs_cond = an_bs_cond(ptr_model);
    printf("Optimal basis condition estimate is %g\n", bs_cond);
    }
  //  rp_hsol_sol(ptr_model);
  ok = model->OKtoSolve(1, solvePhase);
  if (!ok) {printf("NOT OK After Solve???\n");cout<<flush;}
  //  assert(ok);
  printf("model->mlFg_Report() 9\n");cout<<flush;  model->mlFg_Report();cout<<flush;

  printf("Time: Total inverts =  %4d; Total invert  time = %11.4g of Total time = %11.4g", model->totalInverts, model->totalInvertTime, model->totalTime);
  if (model->totalTime > 0.001) 
    printf(" (%6.2f%%)\n", (100*model->totalInvertTime)/model->totalTime);
  else
    printf("\n");
  cout << flush;
  printf("Time: Total rebuilds = %4d; Total rebuild time = %11.4g of Total time = %11.4g", totalRebuilds, totalRebuildTime, model->totalTime);
  if (model->totalTime > 0.001) 
    printf(" (%6.2f%%)\n", (100*totalRebuildTime)/model->totalTime);
  else
    printf("\n");
  cout << flush;
 
#endif
}